

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

int COVER_map_init(COVER_map_t *map,U32 size)

{
  COVER_map_pair_t *__s;
  uint uVar1;
  
  uVar1 = 0x1f;
  if (size != 0) {
    for (; size >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  map->sizeLog = (uVar1 ^ 0xffffffe0) + 0x22;
  uVar1 = 4 << ((byte)uVar1 & 0x1f);
  map->size = uVar1;
  map->sizeMask = uVar1 - 1;
  __s = (COVER_map_pair_t *)malloc((ulong)uVar1 << 3);
  map->data = __s;
  if (__s == (COVER_map_pair_t *)0x0) {
    map->sizeLog = 0;
    map->size = 0;
  }
  else {
    memset(__s,0xff,(ulong)uVar1 << 3);
  }
  return (uint)(__s != (COVER_map_pair_t *)0x0);
}

Assistant:

static int COVER_map_init(COVER_map_t *map, U32 size) {
  map->sizeLog = ZSTD_highbit32(size) + 2;
  map->size = (U32)1 << map->sizeLog;
  map->sizeMask = map->size - 1;
  map->data = (COVER_map_pair_t *)malloc(map->size * sizeof(COVER_map_pair_t));
  if (!map->data) {
    map->sizeLog = 0;
    map->size = 0;
    return 0;
  }
  COVER_map_clear(map);
  return 1;
}